

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.c
# Opt level: O1

int CClass::Lookup(char *name)

{
  bool bVar1;
  CClass **ppCVar2;
  
  ppCVar2 = &first;
  do {
    ppCVar2 = &((CClass *)ppCVar2)->next->next;
    if ((CClass *)ppCVar2 == (CClass *)0x0) {
      return -1;
    }
    bVar1 = RString::PrefixMatch(&((CClass *)ppCVar2)->name,name);
  } while (!bVar1);
  return ((CClass *)ppCVar2)->index;
}

Assistant:

int CClass::Lookup (const char *name)
{
	int nclass;
	CClass *aclass;
	for (aclass = first; aclass; aclass = aclass->next)
		if (aclass->name.PrefixMatch(name))
			return aclass->index;

	return -1;
}